

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_true,_false>::change_branch_(DaTrie<true,_true,_false> *this,Query *query)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  size_t sVar5;
  reference pvVar6;
  byte *pbVar7;
  uint8_t *puVar8;
  reference pvVar9;
  Query *in_RSI;
  ulong __n;
  DaTrie<true,_true,_false> *in_RDI;
  size_t i_1;
  size_t i;
  uint32_t parent_pos;
  size_t num_regress;
  uint32_t value;
  uint32_t child_pos;
  Edge edge;
  value_type_conflict *in_stack_fffffffffffffe58;
  Query *in_stack_fffffffffffffe60;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  vector<char,_std::allocator<char>_> *this_00;
  undefined8 in_stack_fffffffffffffe78;
  DaTrie<true,_true,_false> *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  ulong local_158;
  ulong local_150;
  long local_140;
  uint local_124;
  Edge local_118;
  Query *local_10;
  
  local_10 = in_RSI;
  Edge::Edge(&local_118);
  Query::node_pos(local_10);
  edge_((DaTrie<true,_true,_false> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
        (uint32_t)((ulong)in_RDI >> 0x20),
        (Edge *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
        in_stack_fffffffffffffe88);
  sVar5 = Edge::size(&local_118);
  if (sVar5 == 1) {
    uVar2 = Query::node_pos(local_10);
    pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar2);
    uVar2 = Bc::base(pvVar6);
    pbVar7 = Edge::begin(&local_118);
    uVar3 = uVar2 ^ *pbVar7;
    pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar3);
    bVar1 = Bc::is_leaf(pvVar6);
    if (bVar1) {
      pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar3)
      ;
      local_124 = Bc::value(pvVar6);
      unfix_(in_stack_fffffffffffffe80,(uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_stack_fffffffffffffe70);
      local_140 = 0;
      while (uVar4 = Query::node_pos(local_10), uVar4 != 0) {
        uVar4 = Query::node_pos(local_10);
        pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                           (&in_RDI->bc_,(ulong)uVar4);
        Bc::check(pvVar6);
        in_stack_fffffffffffffe88 = edge_size_(in_RDI,uVar2,in_stack_fffffffffffffe88);
        if (in_stack_fffffffffffffe88 != 1) break;
        Query::node_pos(local_10);
        delete_sib_(in_stack_fffffffffffffe80,(uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20));
        Query::node_pos(local_10);
        unfix_(in_stack_fffffffffffffe80,(uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_stack_fffffffffffffe70)
        ;
        Query::prev(in_stack_fffffffffffffe60,(uint32_t)((ulong)in_stack_fffffffffffffe58 >> 0x20));
        local_140 = local_140 + 1;
      }
      uVar2 = Query::node_pos(local_10);
      pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar2)
      ;
      uVar2 = tail_size((DaTrie<true,_true,_false> *)0x1684a7);
      Bc::set_value(pvVar6,uVar2);
      while (local_140 != 0) {
        Query::key(local_10);
        std::vector<char,_std::allocator<char>_>::push_back
                  (in_stack_fffffffffffffe70,(value_type_conflict *)in_stack_fffffffffffffe68);
        Query::next(local_10);
        local_140 = local_140 + -1;
      }
      this_00 = &in_RDI->tail_;
      Edge::begin(&local_118);
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58);
      puVar8 = Edge::begin(&local_118);
      if (*puVar8 == '\0') {
        for (local_158 = 0; local_158 < 4; local_158 = local_158 + 1) {
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe58);
        }
      }
      else {
        while (pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                                  (&in_RDI->tail_,(ulong)local_124), *pvVar9 != '\0') {
          in_stack_fffffffffffffe68 = &in_RDI->tail_;
          __n = (ulong)local_124;
          local_124 = local_124 + 1;
          std::vector<char,_std::allocator<char>_>::operator[](in_stack_fffffffffffffe68,__n);
          std::vector<char,_std::allocator<char>_>::push_back
                    (this_00,(value_type_conflict *)in_stack_fffffffffffffe68);
          in_RDI->tail_emps_ = in_RDI->tail_emps_ + 1;
        }
        std::vector<char,_std::allocator<char>_>::operator[](&in_RDI->tail_,(ulong)local_124);
        std::vector<char,_std::allocator<char>_>::push_back
                  (this_00,(value_type_conflict *)in_stack_fffffffffffffe68);
        in_RDI->tail_emps_ = in_RDI->tail_emps_ + 1;
        for (local_150 = 0; local_124 = local_124 + 1, local_150 < 4; local_150 = local_150 + 1) {
          std::vector<char,_std::allocator<char>_>::operator[](&in_RDI->tail_,(ulong)local_124);
          std::vector<char,_std::allocator<char>_>::push_back
                    (this_00,(value_type_conflict *)in_stack_fffffffffffffe68);
          in_RDI->tail_emps_ = in_RDI->tail_emps_ + 1;
        }
      }
    }
  }
  Edge::~Edge(&local_118);
  return;
}

Assistant:

void change_branch_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    Edge edge;
    edge_(query.node_pos(), edge, 2);

    if (edge.size() != 1) {
      return;
    }

    auto child_pos = bc_[query.node_pos()].base() ^*edge.begin();
    if (!bc_[child_pos].is_leaf()) {
      return;
    }

    auto value = bc_[child_pos].value();
    unfix_(child_pos, blocks_);

    size_t num_regress = 0;
    while (query.node_pos() != ROOT_POS) {
      auto parent_pos = bc_[query.node_pos()].check();
      if (edge_size_(parent_pos, 2) != 1) {
        break;
      }
      if (WithNLM) {
        delete_sib_(query.node_pos());
      }
      unfix_(query.node_pos(), blocks_);
      query.prev(parent_pos);
      ++num_regress;
    }

    bc_[query.node_pos()].set_value(tail_size());
    while (0 < num_regress--) {
      tail_.push_back(*query.key());
      query.next();
    }
    tail_.push_back(*edge.begin());

    if (*edge.begin() != '\0') {
      while (tail_[value] != '\0') {
        tail_.push_back(tail_[value++]);
        ++tail_emps_;
      }
      tail_.push_back(tail_[value++]);
      ++tail_emps_;
      for (size_t i = 0; i < sizeof(uint32_t); ++i) {
        tail_.push_back(tail_[value++]);
        ++tail_emps_;
      }
    } else {
      for (size_t i = 0; i < sizeof(uint32_t); ++i) {
        tail_.push_back(static_cast<uint8_t>(value & 0xFF));
        value >>= 8;
      }
    }
  }